

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SSTable.cpp
# Opt level: O0

void __thiscall
SSTable::toSSTable(SSTable *this,SSTableDic *dic,string *fileName,uint64_t timeStamp)

{
  uint64_t n;
  byte bVar1;
  bool bVar2;
  _Ios_Openmode _Var3;
  int iVar4;
  runtime_error *this_00;
  size_type n_00;
  const_reference pvVar5;
  reference ppVar6;
  long lVar7;
  void *__buf;
  pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pair_1;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  SSTableDic *__range1_1;
  pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pair;
  const_iterator __end1;
  const_iterator __begin1;
  SSTableDic *__range1;
  undefined1 local_2a90 [4];
  uint32_t offset;
  BloomFilter bloomFilter;
  unsigned_long max;
  unsigned_long min;
  size_type length;
  char local_270 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250 [48];
  ofstream local_220 [8];
  ofstream out;
  uint64_t timeStamp_local;
  string *fileName_local;
  SSTableDic *dic_local;
  
  _Var3 = std::operator|(_S_out,_S_bin);
  _Var3 = std::operator|(_Var3,_S_trunc);
  std::ofstream::ofstream(local_220,(string *)dic,_Var3);
  bVar1 = std::ios::fail();
  if ((bVar1 & 1) == 0) {
    n_00 = std::
           vector<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::size((vector<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)this);
    pvVar5 = std::
             vector<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((vector<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)this,0);
    n = pvVar5->first;
    pvVar5 = std::
             vector<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::back((vector<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)this);
    bloomFilter.bits.super__Base_bitset<1280UL>._M_w[0x4ff] = pvVar5->first;
    write64(local_220,(uint64_t)fileName);
    write64(local_220,n_00);
    write64(local_220,n);
    write64(local_220,bloomFilter.bits.super__Base_bitset<1280UL>._M_w[0x4ff]);
    BloomFilter::BloomFilter((BloomFilter *)local_2a90,(SSTableDic *)this);
    BloomFilter::write((BloomFilter *)local_2a90,(int)local_220,__buf,timeStamp);
    __range1._4_4_ = 0;
    __end1 = std::
             vector<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::begin((vector<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)this);
    pair = (pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)std::
              vector<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::end((vector<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)this);
    while( true ) {
      bVar2 = __gnu_cxx::operator!=
                        (&__end1,(__normal_iterator<const_std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                  *)&pair);
      if (!bVar2) break;
      ppVar6 = __gnu_cxx::
               __normal_iterator<const_std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               ::operator*(&__end1);
      write64(local_220,ppVar6->first);
      write32(local_220,__range1._4_4_);
      iVar4 = std::__cxx11::string::size();
      __range1._4_4_ = __range1._4_4_ + iVar4;
      __gnu_cxx::
      __normal_iterator<const_std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::operator++(&__end1);
    }
    write64(local_220,0);
    write32(local_220,__range1._4_4_);
    __end1_1 = std::
               vector<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::begin((vector<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)this);
    pair_1 = (pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)std::
                vector<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::end((vector<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)this);
    while( true ) {
      bVar2 = __gnu_cxx::operator!=
                        (&__end1_1,
                         (__normal_iterator<const_std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          *)&pair_1);
      if (!bVar2) break;
      __gnu_cxx::
      __normal_iterator<const_std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::operator*(&__end1_1);
      lVar7 = std::__cxx11::string::c_str();
      std::__cxx11::string::size();
      std::ostream::write((char *)local_220,lVar7);
      __gnu_cxx::
      __normal_iterator<const_std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::operator++(&__end1_1);
    }
    std::ofstream::close();
    std::ofstream::~ofstream(local_220);
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+(local_270,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 "toSSTable(dic): Open file ");
  std::operator+(local_250,local_270);
  std::runtime_error::runtime_error(this_00,(string *)local_250);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void SSTable::toSSTable(const SSTableDic &dic, const string &fileName,
                        uint64_t timeStamp) {
  ofstream out(fileName, ios::out | ios::binary | ios::trunc);
  if (out.fail())
    throw runtime_error("toSSTable(dic): Open file " + fileName + " failed!");

  auto length = dic.size();
  auto min = dic[0].first;
  auto max = dic.back().first;

  // Header
  write64(out, timeStamp);
  write64(out, length);
  write64(out, min);
  write64(out, max);

  // BloomFilter
  BloomFilter bloomFilter(dic);
  bloomFilter.write(out);

  // Key, Offset
  uint32_t offset = 0;
  for (const auto &pair : dic) {
    write64(out, pair.first);
    write32(out, offset);
    offset += pair.second.size();
  }
  write64(out, 0);
  write32(out, offset);

  // Value
  for (const auto &pair : dic) {
    out.write(pair.second.c_str(), (long)pair.second.size());
  }

  out.close();
}